

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

Status __thiscall
wallet::MockableCursor::Next(MockableCursor *this,DataStream *key,DataStream *value)

{
  long lVar1;
  bool bVar2;
  size_t in_RCX;
  DataStream *in_RDX;
  DataStream *in_RSI;
  _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  type *value_data;
  type *key_data;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  _Self *in_stack_ffffffffffffff80;
  Span<const_std::byte> *in_stack_ffffffffffffff88;
  Status local_2c;
  int local_28;
  void *local_20;
  int local_18;
  void *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)in_RDI[3]._M_node & 1) == 0) {
    local_2c = FAIL;
  }
  else {
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if (bVar2) {
      local_2c = DONE;
    }
    else {
      DataStream::clear((DataStream *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
      ;
      DataStream::clear((DataStream *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
      ;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      std::
      get<0ul,std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>
                ((pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      std::
      get<1ul,std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>
                ((pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      Span<std::byte_const>::Span<std::vector<std::byte,zero_after_free_allocator<std::byte>>>
                (in_stack_ffffffffffffff88,&in_RSI->vch,
                 (type)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      DataStream::write(in_RSI,local_18,local_10,in_RCX);
      Span<std::byte_const>::Span<std::vector<std::byte,zero_after_free_allocator<std::byte>>>
                ((Span<const_std::byte> *)in_RDX,&in_RSI->vch,
                 (type)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      DataStream::write(in_RDX,local_28,local_20,in_RCX);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
      ::operator++(in_RDI,(int)((ulong)in_RDX >> 0x20));
      local_2c = MORE;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status MockableCursor::Next(DataStream& key, DataStream& value)
{
    if (!m_pass) {
        return Status::FAIL;
    }
    if (m_cursor == m_cursor_end) {
        return Status::DONE;
    }
    key.clear();
    value.clear();
    const auto& [key_data, value_data] = *m_cursor;
    key.write(key_data);
    value.write(value_data);
    m_cursor++;
    return Status::MORE;
}